

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O2

size_t jessilib::find<char16_t,char16_t,true>
                 (basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string,
                 basic_string_view<char16_t,_std::char_traits<char16_t>_> in_substring)

{
  size_t sVar1;
  jessilib *pjVar2;
  char16_t *pcVar4;
  char16_t *pcVar5;
  jessilib *this;
  size_t sVar6;
  jessilib *this_00;
  jessilib *this_01;
  decode_result dVar7;
  decode_result dVar8;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_00;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_01;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_02;
  jessilib *pjVar3;
  
  in_string_00._M_len = in_string._M_str;
  this = (jessilib *)in_string._M_len;
  pjVar2 = (jessilib *)in_substring._M_len;
  if (pjVar2 == (jessilib *)0x0) {
    sVar1 = 0;
  }
  else {
    sVar1 = 0xffffffffffffffff;
    if (this != (jessilib *)0x0) {
      if (pjVar2 == (jessilib *)0x1) {
        in_string_00._M_str._0_2_ = *in_substring._M_str;
        in_string_00._M_str._2_6_ = 0;
        sVar1 = find<char16_t,true>(this,in_string_00,(char32_t)in_substring._M_str);
        return sVar1;
      }
      sVar6 = 0;
      for (; sVar1 = 0xffffffffffffffff, pjVar3 = pjVar2, pcVar4 = in_substring._M_str,
          pcVar5 = in_string_00._M_len, this_00 = this, this_01 = pjVar2, pjVar2 <= this;
          this = this + -(long)in_string_02._M_str) {
        do {
          in_string_01._M_str = (char16_t *)pjVar3;
          in_string_01._M_len = (size_t)pcVar5;
          dVar7 = decode_codepoint_utf16<char16_t>(this_00,in_string_01);
          in_string_02._M_str = (char16_t *)dVar7.units;
          in_string_02._M_len = (size_t)pcVar4;
          dVar8 = decode_codepoint_utf16<char16_t>(this_01,in_string_02);
          pjVar3 = (jessilib *)dVar8.units;
          if ((in_string_02._M_str == (char16_t *)0x0) || (pjVar3 == (jessilib *)0x0)) {
            return 0xffffffffffffffff;
          }
          if (dVar7.codepoint != dVar8.codepoint) break;
          if (this_01 + -(long)pjVar3 == (jessilib *)0x0) {
            return sVar6;
          }
          this_00 = this_00 + -(long)in_string_02._M_str;
          pcVar4 = pcVar4 + (long)pjVar3;
          pcVar5 = pcVar5 + (long)in_string_02._M_str;
          this_01 = this_01 + -(long)pjVar3;
        } while (this_00 != (jessilib *)0x0);
        in_string_00._M_len = in_string_00._M_len + (long)in_string_02._M_str;
        sVar6 = sVar6 + (long)in_string_02._M_str;
      }
    }
  }
  return sVar1;
}

Assistant:

std::pair<bool, std::string> ustring_to_mbstring(std::basic_string_view<CharT> in_string) {
	std::pair<bool, std::string> result;

	std::mbstate_t mbstate{};
	decode_result decode;
	while ((decode = decode_codepoint(in_string)).units != 0) {
		in_string.remove_prefix(decode.units);

		char buffer[MB_LEN_MAX]; // MB_LEN_MAX is constant, MB_CUR_MAX is not, and C++ doesn't have VLAs
		size_t bytes_written = std::c32rtomb(buffer, decode.codepoint, &mbstate);
		if (bytes_written > MB_LEN_MAX) {
			// Invalid codepoint; return
			result.first = false;
			return result;
		}

		result.second.append(buffer, bytes_written);
	}

	result.first = true;
	return result;
}